

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O1

uint64_t llvm::hashing::detail::hash_short(char *s,size_t length,uint64_t seed)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (length - 4 < 5) {
    uVar2 = (length + (ulong)*(uint *)s * 8 ^ *(uint *)(s + (length - 4)) ^ seed) *
            -0x622015f714c7d297;
    uVar2 = (uVar2 >> 0x2f ^ *(uint *)(s + (length - 4)) ^ seed ^ uVar2) * -0x622015f714c7d297;
    return (uVar2 >> 0x2f ^ uVar2) * -0x622015f714c7d297;
  }
  if (length - 9 < 8) {
    uVar2 = length + *(ulong *)(s + (length - 8));
    bVar1 = (byte)length & 0x3f;
    uVar2 = uVar2 >> bVar1 | uVar2 << 0x40 - bVar1;
    uVar4 = (seed ^ *(ulong *)s ^ uVar2) * -0x622015f714c7d297;
    uVar2 = (uVar4 >> 0x2f ^ uVar2 ^ uVar4) * -0x622015f714c7d297;
    return (uVar2 >> 0x2f ^ uVar2) * -0x622015f714c7d297 ^ *(ulong *)(s + (length - 8));
  }
  lVar3 = -0x651e95c4d06fbfb1;
  if (length - 0x11 < 0x10) {
    uVar4 = *(long *)(s + (length - 8)) * -0x651e95c4d06fbfb1 ^ seed;
    uVar5 = *(long *)s * -0x4b6d499041670d8d - *(ulong *)(s + 8);
    uVar2 = *(ulong *)(s + 8) ^ 0xc949d7c7509e6557;
    uVar2 = seed + length + *(long *)s * -0x4b6d499041670d8d + (uVar2 << 0x2c | uVar2 >> 0x14) +
            *(long *)(s + (length - 8)) * 0x651e95c4d06fbfb1;
    lVar3 = -0x622015f714c7d297;
    uVar4 = ((uVar4 << 0x22 | uVar4 >> 0x1e) +
             (uVar5 * 0x200000 | uVar5 >> 0x2b) +
             *(long *)(s + (length - 0x10)) * -0x3c5a37a36834ced9 ^ uVar2) * -0x622015f714c7d297;
    uVar2 = (uVar4 >> 0x2f ^ uVar2 ^ uVar4) * -0x622015f714c7d297;
    uVar2 = uVar2 >> 0x2f ^ uVar2;
  }
  else {
    if (0x20 < length) {
      uVar8 = (*(long *)(s + (length - 0x10)) + length) * -0x3c5a37a36834ced9 + *(long *)s;
      uVar2 = uVar8 + *(long *)(s + 0x18);
      uVar9 = uVar8 + *(long *)(s + 8);
      uVar10 = uVar9 + *(long *)(s + 0x10);
      uVar5 = *(long *)(s + 0x10) + *(long *)(s + (length - 0x20));
      uVar4 = uVar5 + *(long *)(s + (length - 8));
      uVar6 = uVar5 + *(long *)(s + (length - 0x18));
      uVar7 = uVar6 + *(long *)(s + (length - 0x10));
      lVar3 = (uVar10 << 0x21 | uVar10 >> 0x1f) +
              (uVar9 << 0x39 | uVar9 >> 7) + (uVar8 * 0x8000000 | uVar8 >> 0x25) +
              (uVar2 * 0x1000 | uVar2 >> 0x34);
      uVar2 = (*(long *)(s + (length - 8)) + uVar7 + lVar3) * -0x3c5a37a36834ced9 +
              ((uVar5 * 0x8000000 | uVar5 >> 0x25) + *(long *)(s + 0x18) +
               (uVar4 * 0x1000 | uVar4 >> 0x34) + (uVar6 << 0x39 | uVar6 >> 7) +
               (uVar7 << 0x21 | uVar7 >> 0x1f) + uVar10) * -0x651e95c4d06fbfb1;
      uVar2 = ((uVar2 >> 0x2f ^ uVar2) * -0x3c5a37a36834ced9 ^ seed) + lVar3;
      return (uVar2 >> 0x2f ^ uVar2) * -0x651e95c4d06fbfb1;
    }
    if (length == 0) {
      return seed ^ 0x9ae16a3b2f90404f;
    }
    uVar2 = (length + (ulong)(byte)s[length - 1] * 4) * -0x36b62838af619aa9 ^ seed ^
            (ulong)CONCAT11(s[length >> 1],*s) * -0x651e95c4d06fbfb1;
    uVar2 = uVar2 >> 0x2f ^ uVar2;
  }
  return uVar2 * lVar3;
}

Assistant:

inline uint64_t hash_short(const char *s, size_t length, uint64_t seed) {
  if (length >= 4 && length <= 8)
    return hash_4to8_bytes(s, length, seed);
  if (length > 8 && length <= 16)
    return hash_9to16_bytes(s, length, seed);
  if (length > 16 && length <= 32)
    return hash_17to32_bytes(s, length, seed);
  if (length > 32)
    return hash_33to64_bytes(s, length, seed);
  if (length != 0)
    return hash_1to3_bytes(s, length, seed);

  return k2 ^ seed;
}